

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

void lua_insert(lua_State *L,int idx)

{
  TValue *pTVar1;
  StkId pTVar2;
  TValue *pTVar3;
  
  pTVar3 = index2adr(L,idx);
  for (pTVar1 = L->top; pTVar3 < pTVar1; pTVar1 = pTVar1 + -1) {
    pTVar1->value = pTVar1[-1].value;
    pTVar1->tt = pTVar1[-1].tt;
  }
  pTVar2 = L->top;
  pTVar3->value = pTVar2->value;
  pTVar3->tt = pTVar2->tt;
  return;
}

Assistant:

LUA_API void lua_insert (lua_State *L, int idx) {
  StkId p;
  StkId q;
  lua_lock(L);
  p = index2adr(L, idx);
  api_checkvalidindex(L, p);
  for (q = L->top; q>p; q--) setobjs2s(L, q, q-1);
  setobjs2s(L, p, L->top);
  lua_unlock(L);
}